

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

void xmlXPathFreeContext(xmlXPathContextPtr ctxt)

{
  if (ctxt != (xmlXPathContextPtr)0x0) {
    if ((xmlXPathContextCachePtr)ctxt->cache != (xmlXPathContextCachePtr)0x0) {
      xmlXPathFreeCache((xmlXPathContextCachePtr)ctxt->cache);
    }
    xmlXPathRegisteredNsCleanup(ctxt);
    xmlXPathRegisteredFuncsCleanup(ctxt);
    xmlXPathRegisteredVariablesCleanup(ctxt);
    xmlResetError(&ctxt->lastError);
    (*xmlFree)(ctxt);
    return;
  }
  return;
}

Assistant:

void
xmlXPathFreeContext(xmlXPathContextPtr ctxt) {
    if (ctxt == NULL) return;

    if (ctxt->cache != NULL)
	xmlXPathFreeCache((xmlXPathContextCachePtr) ctxt->cache);
    xmlXPathRegisteredNsCleanup(ctxt);
    xmlXPathRegisteredFuncsCleanup(ctxt);
    xmlXPathRegisteredVariablesCleanup(ctxt);
    xmlResetError(&ctxt->lastError);
    xmlFree(ctxt);
}